

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::
PrintSerializedPbInterval<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>
          (Generator *this,ServiceDescriptor *descriptor,ServiceDescriptorProto *proto,string *name)

{
  Printer *this_00;
  undefined8 args_1;
  LogMessage *other;
  long lVar1;
  long lVar2;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum local_138;
  string local_108;
  AlphaNum local_e8;
  string local_b8;
  LogFinisher local_92;
  byte local_91;
  LogMessage local_90;
  int local_58;
  int offset;
  undefined1 local_48 [8];
  string sp;
  string *name_local;
  ServiceDescriptorProto *proto_local;
  ServiceDescriptor *descriptor_local;
  Generator *this_local;
  
  sp.field_2._8_8_ = name;
  ServiceDescriptor::CopyTo(descriptor,proto);
  std::__cxx11::string::string((string *)local_48);
  MessageLite::SerializeToString((MessageLite *)proto,(string *)local_48);
  local_58 = std::__cxx11::string::find
                       ((string *)&this->file_descriptor_serialized_,(ulong)local_48);
  local_91 = 0;
  if (local_58 < 0) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x543);
    local_91 = 1;
    other = internal::LogMessage::operator<<(&local_90,"CHECK failed: (offset) >= (0): ");
    internal::LogFinisher::operator=(&local_92,other);
  }
  if ((local_91 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_90);
  }
  args_1 = sp.field_2._8_8_;
  this_00 = this->printer_;
  strings::AlphaNum::AlphaNum(&local_e8,local_58);
  StrCat_abi_cxx11_(&local_b8,(protobuf *)&local_e8,a);
  lVar1 = (long)local_58;
  lVar2 = std::__cxx11::string::size();
  strings::AlphaNum::AlphaNum(&local_138,lVar1 + lVar2);
  StrCat_abi_cxx11_(&local_108,(protobuf *)&local_138,a_00);
  io::Printer::
  Print<char[5],std::__cxx11::string,char[17],std::__cxx11::string,char[15],std::__cxx11::string>
            (this_00,
             "$name$._serialized_start=$serialized_start$\n$name$._serialized_end=$serialized_end$\n"
             ,(char (*) [5])0x77db8d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
             (char (*) [17])"serialized_start",&local_b8,(char (*) [15])"serialized_end",&local_108)
  ;
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Generator::PrintSerializedPbInterval(const DescriptorT& descriptor,
                                          DescriptorProtoT& proto,
                                          const std::string& name) const {
  descriptor.CopyTo(&proto);
  std::string sp;
  proto.SerializeToString(&sp);
  int offset = file_descriptor_serialized_.find(sp);
  GOOGLE_CHECK_GE(offset, 0);

  printer_->Print(
      "$name$._serialized_start=$serialized_start$\n"
      "$name$._serialized_end=$serialized_end$\n",
      "name", name, "serialized_start", StrCat(offset), "serialized_end",
      StrCat(offset + sp.size()));
}